

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O3

float Gia_IffObjTimeTwo(Iff_Man_t *p,int iObj,int *piFanin,float DelayMin)

{
  int iFaninSkip2;
  int *piVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  
  *piFanin = -1;
  if (-1 < iObj) {
    pGVar3 = p->pGia;
    pVVar5 = pGVar3->vMapping;
    uVar4 = pVVar5->nSize;
    if (iObj < (int)uVar4) {
      lVar7 = 0;
      do {
        piVar1 = pVVar5->pArray;
        lVar6 = (long)piVar1[(uint)iObj];
        if ((lVar6 < 0) || (uVar4 <= (uint)piVar1[(uint)iObj])) break;
        if (piVar1[lVar6] <= lVar7) {
          return DelayMin;
        }
        iFaninSkip2 = piVar1[lVar6 + lVar7 + 1];
        if (((long)iFaninSkip2 < 0) || (pGVar3->nObjs <= iFaninSkip2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGVar3->pObjs + iFaninSkip2) & 0x9fffffff) != 0) {
          fVar8 = Gia_IffObjTimeOne(p,iObj,iFaninSkip2,-1);
          iVar2 = Gia_IffObjCount(p->pGia,iObj,iFaninSkip2,-1);
          if (p->pLib->LutMax < iVar2) {
            __assert_fail("nSize <= p->pLib->LutMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIff.c"
                          ,0xb0,"float Gia_IffObjTimeTwo(Iff_Man_t *, int, int *, float)");
          }
          fVar8 = fVar8 + p->pLib->pLutDelays[iVar2][0];
          if (fVar8 < DelayMin) {
            *piFanin = iFaninSkip2;
            DelayMin = fVar8;
          }
        }
        lVar7 = lVar7 + 1;
        pGVar3 = p->pGia;
        pVVar5 = pGVar3->vMapping;
        uVar4 = pVVar5->nSize;
      } while (iObj < (int)uVar4);
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

float Gia_IffObjTimeTwo( Iff_Man_t * p, int iObj, int * piFanin, float DelayMin )
{
    int i, iFanin, nSize;
    float This;
    *piFanin = -1;
    Gia_LutForEachFanin( p->pGia, iObj, iFanin, i )
    {
        if ( Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            continue;
        This = Gia_IffObjTimeOne( p, iObj, iFanin, -1 );
        nSize = Gia_IffObjCount( p->pGia, iObj, iFanin, -1 );
        assert( nSize <= p->pLib->LutMax );
        This += p->pLib->pLutDelays[nSize][0];
        if ( DelayMin > This )
        {
            DelayMin = This;
            *piFanin = iFanin;
        }
    }
    return DelayMin;
}